

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::DrawFrameAndTitle(Window *this)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  string adjusted;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  lVar4 = 0;
  box(this->frame,0,0);
  local_88._M_current = (this->title)._M_dataplus._M_p;
  sVar1 = (this->title)._M_string_length;
  if (0 < (long)sVar1) {
    end._M_current = local_88._M_current + sVar1;
    lVar4 = 0;
    do {
      utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&local_88,end);
      lVar4 = lVar4 + 1;
    } while (local_88._M_current < end._M_current);
  }
  if ((lVar4 == 0) || ((long)this->width < 8)) goto LAB_0018410c;
  text::Ellipsize(&local_40,&this->title,(long)this->width - 6);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x18b311);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  wmove(this->frame,0,2);
  if (this->frame == (WINDOW *)0x0) {
LAB_001840f3:
    plVar2 = local_80;
    if (local_80 == &local_70) goto LAB_0018410c;
  }
  else {
    if (local_80 != (long *)0x0) {
      waddnstr(this->frame,local_80,0xffffffff);
      goto LAB_001840f3;
    }
    plVar2 = (long *)0x0;
  }
  operator_delete(plVar2,local_70 + 1);
LAB_0018410c:
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x31])(this);
  return;
}

Assistant:

void Window::DrawFrameAndTitle() {
    ASSERT_MAIN_THREAD();

    box(this->frame, 0, 0);

    /* draw the title, if one is specified */
    size_t titleLen = u8len(this->title);
    if (titleLen > 0) {
        int max = this->width - 4; /* 4 = corner + space + space + corner */
        if (max > 3) { /* 3 = first character plus ellipse (e.g. 'F..')*/
            std::string adjusted = " " + text::Ellipsize(this->title, (size_t) max - 2) + " ";
            wmove(this->frame, 0, 2);
            checked_waddstr(this->frame, adjusted.c_str());
        }
    }

    this->DecorateFrame();
}